

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cc
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_196f0::IDLTypeIdentifierVisitor::visit_
          (IDLTypeIdentifierVisitor *this,Array *type)

{
  int iVar1;
  Type *type_00;
  long *plVar2;
  UnsupportedType *this_00;
  long *plVar3;
  char *tmp_finish;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> result;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  element_t;
  string local_128;
  char local_fe [6];
  char *local_f8;
  char *local_f0;
  undefined1 *local_e8;
  char *local_e0;
  undefined1 local_d8 [16];
  long *local_c8;
  long local_c0;
  long local_b8;
  long lStack_b0;
  long *local_a8;
  long local_a0;
  long local_98;
  long lStack_90;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  lcast_put_unsigned<std::char_traits<char>,_unsigned_long,_char> local_48;
  
  Typelib::Indirect::getIndirection();
  iVar1 = Typelib::Type::getCategory();
  if (iVar1 != 1) {
    type_00 = (Type *)Typelib::Indirect::getIndirection();
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"");
    getIDLBase(&local_88,type_00,this->m_exporter,&local_128);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p);
    }
    std::__cxx11::string::_M_assign((string *)&this->m_namespace);
    std::__cxx11::string::_M_assign((string *)&this->m_front);
    local_48.m_value = Typelib::Array::getDimension();
    local_e0 = (char *)0x0;
    local_d8[0] = 0;
    local_f8 = (char *)((long)&local_128._M_dataplus._M_p + 2);
    local_48.m_czero = '0';
    local_48.m_zero = 0x30;
    local_f0 = local_fe;
    local_e8 = local_d8;
    local_48.m_finish = local_fe;
    local_f8 = boost::detail::lcast_put_unsigned<std::char_traits<char>,_unsigned_long,_char>::
               convert(&local_48);
    local_f0 = local_fe;
    std::__cxx11::string::replace((ulong)&local_e8,0,local_e0,(ulong)local_f8);
    plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_e8,0,(char *)0x0,0x118182);
    plVar3 = plVar2 + 2;
    if ((long *)*plVar2 == plVar3) {
      local_b8 = *plVar3;
      lStack_b0 = plVar2[3];
      local_c8 = &local_b8;
    }
    else {
      local_b8 = *plVar3;
      local_c8 = (long *)*plVar2;
    }
    local_c0 = plVar2[1];
    *plVar2 = (long)plVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_c8);
    plVar3 = plVar2 + 2;
    if ((long *)*plVar2 == plVar3) {
      local_98 = *plVar3;
      lStack_90 = plVar2[3];
      local_a8 = &local_98;
    }
    else {
      local_98 = *plVar3;
      local_a8 = (long *)*plVar2;
    }
    local_a0 = plVar2[1];
    *plVar2 = (long)plVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    std::__cxx11::string::operator=((string *)&this->m_back,(string *)&local_a8);
    if (local_a8 != &local_98) {
      operator_delete(local_a8);
    }
    if (local_c8 != &local_b8) {
      operator_delete(local_c8);
    }
    if (local_e8 != local_d8) {
      operator_delete(local_e8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88.second._M_dataplus._M_p != &local_88.second.field_2) {
      operator_delete(local_88.second._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88.first._M_dataplus._M_p != &local_88.first.field_2) {
      operator_delete(local_88.first._M_dataplus._M_p);
    }
    return true;
  }
  this_00 = (UnsupportedType *)__cxa_allocate_exception(0x38);
  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_128,"multi-dimensional arrays are not supported in IDL","");
  Typelib::UnsupportedType::UnsupportedType(this_00,(Type *)type,&local_128);
  __cxa_throw(this_00,&Typelib::UnsupportedType::typeinfo,Typelib::UnsupportedType::~UnsupportedType
             );
}

Assistant:

bool IDLTypeIdentifierVisitor::visit_(Array const& type)
    {
        if (type.getIndirection().getCategory() == Type::Array)
            throw UnsupportedType(type, "multi-dimensional arrays are not supported in IDL");

        pair<string, string> element_t = getIDLBase(type.getIndirection());
        m_namespace = element_t.first;
        m_front = element_t.second;
        m_back = "[" + boost::lexical_cast<string>(type.getDimension()) + "]";
        return true;
    }